

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_305e10::cmQtAutoMocUicT::JobT::RunProcess
          (JobT *this,GenT genType,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *infoMessage)

{
  bool bVar1;
  size_t sVar2;
  pointer pcVar3;
  void *pvVar4;
  char *__s;
  size_type sVar5;
  string_view message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_e0;
  string local_c0;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined1 local_90 [32];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_t local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined1 *local_38;
  
  pvVar4 = ((this->super_JobT).Pool_)->UserData_;
  if (*(int *)((long)pvVar4 + 0x38) != 0) {
    if (infoMessage == (string *)0x0) {
      __s = "";
      sVar5 = 0;
      pcVar3 = (pointer)0x0;
    }
    else {
      pcVar3 = (infoMessage->_M_dataplus)._M_p;
      sVar5 = infoMessage->_M_string_length;
      if (sVar5 == 0) {
        __s = "";
        sVar5 = 0;
      }
      else {
        __s = "\n";
        if (pcVar3[sVar5 - 1] == '\n') {
          __s = "";
        }
      }
    }
    sVar2 = strlen(__s);
    cmQtAutoGen::QuotedCommand(&local_c0,command);
    local_50 = local_c0._M_string_length;
    local_48 = local_c0._M_dataplus._M_p;
    local_98 = local_90;
    local_a0 = 1;
    local_90[0] = 10;
    local_40 = 1;
    views._M_len = 4;
    views._M_array = &local_70;
    local_70._M_len = sVar5;
    local_70._M_str = pcVar3;
    local_60 = sVar2;
    local_58 = __s;
    local_38 = local_98;
    cmCatViews_abi_cxx11_(&local_e0,views);
    message._M_str = local_e0._M_dataplus._M_p;
    message._M_len = local_e0._M_string_length;
    cmQtAutoGenerator::Logger::Info((Logger *)((long)pvVar4 + 0x10),genType,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    pvVar4 = ((this->super_JobT).Pool_)->UserData_;
  }
  bVar1 = cmWorkerPool::JobT::RunProcess
                    (&this->super_JobT,result,command,(string *)((long)pvVar4 + 0x138));
  return bVar1;
}

Assistant:

bool cmQtAutoMocUicT::JobT::RunProcess(GenT genType,
                                       cmWorkerPool::ProcessResultT& result,
                                       std::vector<std::string> const& command,
                                       std::string* infoMessage)
{
  // Log command
  if (this->Log().Verbose()) {
    cm::string_view info;
    if (infoMessage != nullptr) {
      info = *infoMessage;
    }
    this->Log().Info(
      genType,
      cmStrCat(info, info.empty() || cmHasSuffix(info, '\n') ? "" : "\n",
               QuotedCommand(command), '\n'));
  }
  // Run command
  return this->cmWorkerPool::JobT::RunProcess(
    result, command, this->BaseConst().AutogenBuildDir);
}